

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.h
# Opt level: O0

void __thiscall btBoxShape::getPlaneEquation(btBoxShape *this,btVector4 *plane,int i)

{
  btVector3 *pbVar1;
  btScalar *pbVar2;
  undefined4 in_EDX;
  btVector4 *in_RSI;
  btBoxShape *in_RDI;
  btVector3 halfExtents;
  btScalar local_88;
  btScalar local_84;
  btScalar local_80;
  btScalar local_7c;
  btScalar local_78;
  btScalar local_74;
  btScalar local_70;
  btScalar local_6c;
  btScalar local_68;
  btScalar local_64;
  btScalar local_60;
  btScalar local_5c;
  btScalar local_58;
  btScalar local_54;
  btScalar local_50;
  btScalar local_4c;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34;
  btScalar local_30;
  btScalar local_2c;
  btVector3 local_28;
  undefined4 local_14;
  btVector4 *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  pbVar1 = getHalfExtentsWithoutMargin(in_RDI);
  local_28.m_floats._0_8_ = *(undefined8 *)pbVar1->m_floats;
  local_28.m_floats._8_8_ = *(undefined8 *)(pbVar1->m_floats + 2);
  switch(local_14) {
  case 0:
    local_2c = 1.0;
    local_30 = 0.0;
    local_34 = 0.0;
    pbVar2 = btVector3::x(&local_28);
    local_38 = -*pbVar2;
    btVector4::setValue(local_10,&local_2c,&local_30,&local_34,&local_38);
    break;
  case 1:
    local_3c = -1.0;
    local_40 = 0.0;
    local_44 = 0.0;
    pbVar2 = btVector3::x(&local_28);
    local_48 = -*pbVar2;
    btVector4::setValue(local_10,&local_3c,&local_40,&local_44,&local_48);
    break;
  case 2:
    local_4c = 0.0;
    local_50 = 1.0;
    local_54 = 0.0;
    pbVar2 = btVector3::y(&local_28);
    local_58 = -*pbVar2;
    btVector4::setValue(local_10,&local_4c,&local_50,&local_54,&local_58);
    break;
  case 3:
    local_5c = 0.0;
    local_60 = -1.0;
    local_64 = 0.0;
    pbVar2 = btVector3::y(&local_28);
    local_68 = -*pbVar2;
    btVector4::setValue(local_10,&local_5c,&local_60,&local_64,&local_68);
    break;
  case 4:
    local_6c = 0.0;
    local_70 = 0.0;
    local_74 = 1.0;
    pbVar2 = btVector3::z(&local_28);
    local_78 = -*pbVar2;
    btVector4::setValue(local_10,&local_6c,&local_70,&local_74,&local_78);
    break;
  case 5:
    local_7c = 0.0;
    local_80 = 0.0;
    local_84 = -1.0;
    pbVar2 = btVector3::z(&local_28);
    local_88 = -*pbVar2;
    btVector4::setValue(local_10,&local_7c,&local_80,&local_84,&local_88);
  }
  return;
}

Assistant:

virtual void	getPlaneEquation(btVector4& plane,int i) const
	{
		btVector3 halfExtents = getHalfExtentsWithoutMargin();

		switch (i)
		{
		case 0:
			plane.setValue(btScalar(1.),btScalar(0.),btScalar(0.),-halfExtents.x());
			break;
		case 1:
			plane.setValue(btScalar(-1.),btScalar(0.),btScalar(0.),-halfExtents.x());
			break;
		case 2:
			plane.setValue(btScalar(0.),btScalar(1.),btScalar(0.),-halfExtents.y());
			break;
		case 3:
			plane.setValue(btScalar(0.),btScalar(-1.),btScalar(0.),-halfExtents.y());
			break;
		case 4:
			plane.setValue(btScalar(0.),btScalar(0.),btScalar(1.),-halfExtents.z());
			break;
		case 5:
			plane.setValue(btScalar(0.),btScalar(0.),btScalar(-1.),-halfExtents.z());
			break;
		default:
			btAssert(0);
		}
	}